

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O1

Result wabt::ParseUint128(char *s,char *end,v128 *out)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  if (s != end) {
    out->v[0] = '\0';
    out->v[1] = '\0';
    out->v[2] = '\0';
    out->v[3] = '\0';
    out->v[4] = '\0';
    out->v[5] = '\0';
    out->v[6] = '\0';
    out->v[7] = '\0';
    out->v[8] = '\0';
    out->v[9] = '\0';
    out->v[10] = '\0';
    out->v[0xb] = '\0';
    out->v[0xc] = '\0';
    out->v[0xd] = '\0';
    out->v[0xe] = '\0';
    out->v[0xf] = '\0';
    do {
      uVar4 = (int)*s - 0x30;
      iVar7 = 1;
      if (uVar4 < 10) {
        uVar8 = *(uint *)out->v;
        uVar5 = uVar4 + *(int *)out->v;
        *(uint *)out->v = uVar5;
        uVar2 = *(uint *)(out->v + 4);
        uVar1 = *(uint *)(out->v + 8);
        uVar4 = (uint)CARRY4(uVar4,uVar8);
        uVar6 = uVar2 + uVar4;
        *(uint *)(out->v + 4) = uVar6;
        uVar8 = (uint)CARRY4(uVar2,uVar4);
        uVar2 = uVar1 + uVar8;
        *(uint *)(out->v + 8) = uVar2;
        uVar4 = *(uint *)(out->v + 0xc);
        uVar8 = (uint)CARRY4(uVar1,uVar8);
        iVar3 = uVar4 + uVar8;
        *(int *)(out->v + 0xc) = iVar3;
        if (!CARRY4(uVar4,uVar8)) {
          s = s + 1;
          if (s == end) {
            iVar7 = 3;
          }
          else {
            uVar4 = ((uVar5 >> 0x1d) - ((int)uVar5 >> 0x1f)) + (uint)CARRY4(uVar5 * 8,uVar5 * 2);
            uVar8 = (uint)CARRY4(uVar6 * 8,uVar6 * 2) + ((uVar6 >> 0x1d) - ((int)uVar6 >> 0x1f)) +
                    (uint)CARRY4(uVar6 * 10,uVar4);
            *(uint *)out->v = uVar5 * 10;
            *(uint *)(out->v + 4) = uVar6 * 10 + uVar4;
            *(uint *)(out->v + 8) = uVar2 * 10 + uVar8;
            *(uint *)(out->v + 0xc) =
                 iVar3 * 10 +
                 ((uVar2 >> 0x1d) - ((int)uVar2 >> 0x1f)) + (uint)CARRY4(uVar2 * 8,uVar2 * 2) +
                 (uint)CARRY4(uVar2 * 10,uVar8);
            iVar7 = 0;
          }
        }
      }
    } while (iVar7 == 0);
    if (iVar7 != 1) {
      return (Result)Ok;
    }
  }
  return (Result)Error;
}

Assistant:

Result ParseUint128(const char* s,
                    const char* end,
                    v128* out) {
  if (s == end) {
    return Result::Error;
  }

  out->set_zero();

  while (true) {
    uint32_t digit = (*s - '0');
    if (digit > 9) {
      return Result::Error;
    }

    uint32_t carry_into_v1 = 0;
    uint32_t carry_into_v2 = 0;
    uint32_t carry_into_v3 = 0;
    uint32_t overflow = 0;
    out->set_u32(0, AddWithCarry(out->u32(0), digit, &carry_into_v1));
    out->set_u32(1, AddWithCarry(out->u32(1), carry_into_v1, &carry_into_v2));
    out->set_u32(2, AddWithCarry(out->u32(2), carry_into_v2, &carry_into_v3));
    out->set_u32(3, AddWithCarry(out->u32(3), carry_into_v3, &overflow));
    if (overflow) {
      return Result::Error;
    }

    ++s;

    if (s == end) {
      break;
    }

    Mul10(out);
  }
  return Result::Ok;
}